

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonException.h
# Opt level: O3

void __thiscall Json::JsonException::error_info(JsonException *this,int size)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  long *plVar4;
  string *psVar5;
  char *pcVar6;
  int iVar7;
  string subErrorTextBackward;
  string subErrorTextForward;
  stringstream ss;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  string local_220;
  string *local_200;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  long local_1b8 [2];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  iVar7 = (this->__reader).__ptr;
  iVar1 = (this->__reader).__len;
  JsonReader::substr_abi_cxx11_(&local_220,&this->__reader,size,true);
  JsonReader::substr_abi_cxx11_(&local_1f8,&this->__reader,size,false);
  escape_rs(this,&local_1f8);
  escape_rs(this,&local_220);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Error: JSON document parsing failed: [",0x26);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar7 + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__cxx11::stringbuf::str();
  psVar5 = &this->__err;
  std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_240);
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  iVar7 = (int)(stringstream *)local_1b8;
  std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + iVar7);
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"==> ",4);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Error Text: [...",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_220._M_dataplus._M_p,
                      CONCAT44(local_220._M_string_length._4_4_,(int)local_220._M_string_length));
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"...]",4);
  std::__cxx11::stringbuf::str();
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1d8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_230 = *plVar4;
    lStack_228 = plVar3[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *plVar4;
    local_240 = (long *)*plVar3;
  }
  local_238 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_240);
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  iVar1 = (int)local_238;
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1b8[0] + -0x18));
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  std::__cxx11::stringbuf::str(local_1a0);
  local_200 = psVar5;
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if (0 < iVar1) {
    iVar7 = 0;
    do {
      pcVar6 = "~";
      if ((int)local_220._M_string_length + 0x13 == iVar7) {
        pcVar6 = "^";
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,1);
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)local_200,(ulong)local_240);
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void error_info(int size = 10) const {
            int pos = __reader.pos() - 1;
            int len = __reader.length();
            std::string subErrorTextBackward = __reader.substr(size, true);
            std::string subErrorTextForward = __reader.substr(size);
            escape_rs(subErrorTextForward);
            escape_rs(subErrorTextBackward);
            std::stringstream ss;
            ss << "Error: JSON document parsing failed: [" << pos << "," << len << "] " << "\n";
            __err += ss.str();
            ss.clear(), ss.str("");
            ss << "==> " << "Error Text: [..."
               << subErrorTextBackward
               << subErrorTextForward << "...]";
            __err += ss.str() + "\n";
            int __ptr = subErrorTextBackward.size() + 19;
            int __len = ss.str().size();
            ss.clear(), ss.str("");
            for (int i = 0; i < __len; ++i) {
                if (i == __ptr)
                    ss << "^";
                else
                    ss << "~";
            }
            __err += ss.str();
        }